

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

string * __thiscall
CMU462::Application::info_abi_cxx11_(string *__return_storage_ptr__,Application *this)

{
  string *psVar1;
  
  if (this->noGUI == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  psVar1 = (string *)
           (*(code *)(&DAT_001ea0c0 +
                     *(int *)(&DAT_001ea0c0 + (ulong)*(uint *)&(this->super_Renderer).field_0xc * 4)
                     ))();
  return psVar1;
}

Assistant:

string Application::info() {
  if(noGUI) { return ""; }
  switch (mode) {
    case MODEL_MODE:
      return "MeshEdit";
      break;
    case ANIMATE_MODE:
      return "Animation";
      break;
    case RENDER_MODE:
    case VISUALIZE_MODE:
      return "PathTracer";
      break;
  }
}